

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O3

BinsSelectExpr *
slang::ast::SetExprBinsSelectExpr::fromSyntax
          (SimpleBinsSelectExprSyntax *syntax,ASTContext *context)

{
  Scope *pSVar1;
  Compilation *this;
  Symbol *pSVar2;
  ExpressionSyntax *pEVar3;
  Symbol *pSVar4;
  Type *this_00;
  undefined1 auVar5 [16];
  bool bVar6;
  int iVar7;
  size_t __n;
  Expression *pEVar8;
  Type *pTVar9;
  SetExprBinsSelectExpr *pSVar10;
  BinsSelectExpr *pBVar11;
  string_view sVar12;
  SourceRange sourceRange;
  Expression *matches;
  bitmask<slang::ast::ASTFlags> extraFlags;
  
  pSVar1 = (context->scope).ptr;
  this = pSVar1->compilation;
  pSVar2 = pSVar1->thisSym;
  pEVar3 = (syntax->expr).ptr;
  if ((pEVar3->super_SyntaxNode).kind == IdentifierName) {
    pSVar4 = pSVar2->parentScope->thisSym;
    sVar12 = parsing::Token::valueText((Token *)(pEVar3 + 1));
    __n = sVar12._M_len;
    if (__n == (pSVar4->name)._M_len) {
      if (__n != 0) {
        iVar7 = bcmp(sVar12._M_str,(pSVar4->name)._M_str,__n);
        if (iVar7 != 0) goto LAB_00767f24;
      }
      if (syntax->matchesClause != (MatchesClauseSyntax *)0x0) {
        sourceRange = slang::syntax::SyntaxNode::sourceRange
                                (&syntax->matchesClause->super_SyntaxNode);
        ASTContext::addDiag(context,(DiagCode)0x610007,sourceRange);
      }
      pBVar11 = &BumpAllocator::emplace<slang::ast::CrossIdBinsSelectExpr>
                           (&this->super_BumpAllocator)->super_BinsSelectExpr;
      return pBVar11;
    }
  }
LAB_00767f24:
  extraFlags.m_bits = 0;
  if (syntax->matchesClause != (MatchesClauseSyntax *)0x0) {
    pEVar8 = bindCovergroupExpr(*(ExpressionSyntax **)
                                 &(syntax->matchesClause->pattern).ptr[1].super_SyntaxNode,context,
                                (Type *)0x0,(bitmask<slang::ast::ASTFlags>)0x200);
    extraFlags.m_bits = (underlying_type)pEVar8;
    bVar6 = Expression::bad(pEVar8);
    if (!bVar6) {
      this_00 = (pEVar8->type).ptr;
      pTVar9 = this_00->canonical;
      if (pTVar9 == (Type *)0x0) {
        Type::resolveCanonical(this_00);
        pTVar9 = this_00->canonical;
      }
      if ((pTVar9->super_Symbol).kind != UnboundedType) {
        ASTContext::requireIntegral(context,pEVar8);
      }
    }
  }
  auVar5._8_8_ = 0;
  auVar5._0_8_ = context;
  pEVar8 = Expression::bindRValue
                     ((Expression *)pSVar2[1].originatingSyntax,(Type *)(syntax->expr).ptr,
                      (ExpressionSyntax *)0x0,(SourceRange)(auVar5 << 0x40),(ASTContext *)0x0,
                      extraFlags);
  pSVar10 = BumpAllocator::
            emplace<slang::ast::SetExprBinsSelectExpr,slang::ast::Expression_const&,slang::ast::Expression_const*&>
                      (&this->super_BumpAllocator,pEVar8,(Expression **)&stack0xffffffffffffffc8);
  return &pSVar10->super_BinsSelectExpr;
}

Assistant:

BinsSelectExpr& SetExprBinsSelectExpr::fromSyntax(const SimpleBinsSelectExprSyntax& syntax,
                                                  const ASTContext& context) {
    auto& body = context.scope->asSymbol().as<CoverCrossBodySymbol>();
    SLANG_ASSERT(body.crossQueueType);

    auto parent = body.getParentScope();
    SLANG_ASSERT(parent);

    // If the syntax is a simple identifier that names our parent cross,
    // we're selecting the whole cross (which is otherwise not an expression).
    auto& comp = context.getCompilation();
    auto& cross = parent->asSymbol().as<CoverCrossSymbol>();
    if (syntax.expr->kind == SyntaxKind::IdentifierName &&
        syntax.expr->as<IdentifierNameSyntax>().identifier.valueText() == cross.name) {

        if (syntax.matchesClause)
            context.addDiag(diag::InvalidBinsMatches, syntax.matchesClause->sourceRange());

        return *comp.emplace<CrossIdBinsSelectExpr>();
    }

    const Expression* matches = nullptr;
    if (syntax.matchesClause) {
        matches =
            &bindCovergroupExpr(*syntax.matchesClause->pattern->as<ExpressionPatternSyntax>().expr,
                                context, nullptr, ASTFlags::AllowUnboundedLiteral);
        if (!matches->bad() && !matches->type->isUnbounded())
            context.requireIntegral(*matches);
    }

    auto& expr = Expression::bindRValue(*body.crossQueueType, *syntax.expr, {}, context);
    return *comp.emplace<SetExprBinsSelectExpr>(expr, matches);
}